

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BitSet.cpp
# Opt level: O1

void __thiscall BitSet::BitSet(BitSet *this,unsigned_long *bits_,int nlongs)

{
  long lVar1;
  ulong in_RAX;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  undefined8 uStack_28;
  
  uVar6 = nlongs * 0x20;
  uStack_28 = in_RAX & 0xffffffffffffff;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&this->storage,(long)(int)uVar6,(bool *)((long)&uStack_28 + 7),
             (allocator_type *)((long)&uStack_28 + 6));
  if (0 < nlongs) {
    lVar1 = (long)(this->storage).super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    uVar3 = 1;
    if (1 < (int)uVar6) {
      uVar3 = (ulong)uVar6;
    }
    uVar2 = 0;
    do {
      uVar4 = uVar2 >> 6;
      uVar5 = 1L << ((byte)uVar2 & 0x3f);
      if (((uint)bits_[uVar2 >> 5 & 0x7ffffff] >> ((uint)uVar2 & 0x1f) & 1) == 0) {
        uVar5 = ~uVar5 & *(ulong *)(lVar1 + uVar4 * 8);
      }
      else {
        uVar5 = uVar5 | *(ulong *)(lVar1 + uVar4 * 8);
      }
      *(ulong *)(lVar1 + uVar4 * 8) = uVar5;
      uVar2 = uVar2 + 1;
    } while (uVar3 != uVar2);
  }
  return;
}

Assistant:

BitSet::BitSet(const unsigned long* bits_,int nlongs)
	: storage(nlongs*32)
{
	for (int i=0;i<nlongs*32;i++) {
		storage[i] = (bits_[i>>5] & (1UL << (i&31))) ? true : false;
	}
}